

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_LZWDecoder.cc
# Opt level: O0

ssize_t __thiscall Pl_LZWDecoder::write(Pl_LZWDecoder *this,int __fd,void *__buf,size_t __n)

{
  uchar uVar1;
  uint uVar2;
  undefined4 in_register_00000034;
  void *local_28;
  size_t i;
  size_t len_local;
  uchar *bytes_local;
  Pl_LZWDecoder *this_local;
  
  for (local_28 = (void *)0x0; local_28 < __buf; local_28 = (void *)((long)local_28 + 1)) {
    uVar1 = *(uchar *)(CONCAT44(in_register_00000034,__fd) + (long)local_28);
    uVar2 = this->next_char_;
    this->next_char_ = uVar2 + 1;
    this->buf[uVar2] = uVar1;
    if (this->next_char_ == 3) {
      this->next_char_ = 0;
    }
    this->bits_available = this->bits_available + 8;
    if (this->code_size <= this->bits_available) {
      sendNextCode(this);
    }
  }
  return (ssize_t)local_28;
}

Assistant:

void
Pl_LZWDecoder::write(unsigned char const* bytes, size_t len)
{
    for (size_t i = 0; i < len; ++i) {
        buf[next_char_++] = bytes[i];
        if (next_char_ == 3) {
            next_char_ = 0;
        }
        this->bits_available += 8;
        if (this->bits_available >= this->code_size) {
            sendNextCode();
        }
    }
}